

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManCutVolume_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return iVar2;
    }
    pObj->TravId = p->nTravIds;
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) break;
    iVar1 = Llb_ManCutVolume_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    iVar2 = iVar2 + iVar1 + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                ,0x136,"int Llb_ManCutVolume_rec(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

int Llb_ManCutVolume_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Aig_ObjSetTravIdCurrent(p, pObj);
    assert( Aig_ObjIsNode(pObj) );
    return 1 + Llb_ManCutVolume_rec(p, Aig_ObjFanin0(pObj)) + 
        Llb_ManCutVolume_rec(p, Aig_ObjFanin1(pObj));
}